

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompactCheck.h
# Opt level: O3

string * __thiscall
cppqc::CompactCheck<C_A_T_C_H_T_E_S_T_0()::$_0,void,void,bool>::name_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  long lVar1;
  
  lVar1 = *(long *)((long)this + 0x18);
  if (lVar1 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"no-name","");
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,*(long *)((long)this + 0x10),
               lVar1 + *(long *)((long)this + 0x10));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string name() const override {
    return m_name.empty() ? "no-name" : m_name;
  }